

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.h
# Opt level: O0

void __thiscall
StackVector<std::pair<unsigned_long,_unsigned_long>_>::Push
          (StackVector<std::pair<unsigned_long,_unsigned_long>_> *this,
          pair<unsigned_long,_unsigned_long> In)

{
  int iVar1;
  StackVector<std::pair<unsigned_long,_unsigned_long>_> *this_local;
  pair<unsigned_long,_unsigned_long> In_local;
  
  In_local.first = In.second;
  this_local = (StackVector<std::pair<unsigned_long,_unsigned_long>_> *)In.first;
  if (this->CurSize + 1 < 0x41) {
    iVar1 = this->CurSize;
    this->CurSize = iVar1 + 1;
    std::pair<unsigned_long,_unsigned_long>::operator=(this->Stack + iVar1,(type)&this_local);
  }
  else {
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back(&this->Heap,(value_type *)&this_local);
    this->CurSize = this->CurSize + 1;
  }
  return;
}

Assistant:

void Push(T In)
	{
		if (CurSize + 1 > STACKVECTOR_SIZE) {
			Heap.push_back(In);
			CurSize++;
		} else {
			Stack[CurSize++] = In;
		}
	}